

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  GetterXsYs<float> *pGVar12;
  TransformerLogLog *pTVar13;
  ImPlotPlot *pIVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  ushort uVar20;
  ImPlotContext *pIVar21;
  ImPlotContext *pIVar22;
  bool bVar23;
  long lVar24;
  ImDrawIdx IVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  pIVar21 = GImPlot;
  pGVar12 = this->Getter1;
  pTVar13 = this->Transformer;
  iVar11 = pGVar12->Count;
  lVar24 = (long)(((pGVar12->Offset + prim + 1) % iVar11 + iVar11) % iVar11) * (long)pGVar12->Stride
  ;
  fVar2 = *(float *)((long)pGVar12->Ys + lVar24);
  dVar17 = log10((double)*(float *)((long)pGVar12->Xs + lVar24) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar7 = pIVar21->LogDenX;
  pIVar14 = pIVar21->CurrentPlot;
  dVar8 = (pIVar14->XAxis).Range.Min;
  dVar9 = (pIVar14->XAxis).Range.Max;
  dVar18 = log10((double)fVar2 / pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  pIVar22 = GImPlot;
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar21->CurrentPlot;
  dVar10 = pIVar14->YAxis[iVar11].Range.Min;
  fVar28 = (float)((((double)(float)(dVar17 / dVar7) * (dVar9 - dVar8) + dVar8) -
                   (pIVar14->XAxis).Range.Min) * pIVar21->Mx +
                  (double)pIVar21->PixelRange[iVar11].Min.x);
  fVar27 = (float)((((double)(float)(dVar18 / pIVar21->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar10) + dVar10) - dVar10) *
                   pIVar21->My[iVar11] + (double)pIVar21->PixelRange[iVar11].Min.y);
  pGVar12 = this->Getter2;
  pTVar13 = this->Transformer;
  iVar11 = pGVar12->Count;
  lVar24 = (long)(((prim + 1 + pGVar12->Offset) % iVar11 + iVar11) % iVar11) * (long)pGVar12->Stride
  ;
  fVar2 = *(float *)((long)pGVar12->Ys + lVar24);
  dVar17 = log10((double)*(float *)((long)pGVar12->Xs + lVar24) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar7 = pIVar22->LogDenX;
  pIVar14 = pIVar22->CurrentPlot;
  dVar8 = (pIVar14->XAxis).Range.Min;
  dVar9 = (pIVar14->XAxis).Range.Max;
  dVar18 = log10((double)fVar2 / pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar22->CurrentPlot;
  dVar10 = pIVar14->YAxis[iVar11].Range.Min;
  fVar32 = (float)((((double)(float)(dVar17 / dVar7) * (dVar9 - dVar8) + dVar8) -
                   (pIVar14->XAxis).Range.Min) * pIVar22->Mx +
                  (double)pIVar22->PixelRange[iVar11].Min.x);
  fVar34 = (float)((((double)(float)(dVar18 / pIVar22->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar10) + dVar10) - dVar10) *
                   pIVar22->My[iVar11] + (double)pIVar22->PixelRange[iVar11].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar30 = fVar3;
  if (fVar5 <= fVar3) {
    fVar30 = fVar5;
  }
  if (fVar27 <= fVar30) {
    fVar30 = fVar27;
  }
  if (fVar34 <= fVar30) {
    fVar30 = fVar34;
  }
  bVar23 = false;
  if ((fVar30 < (cull_rect->Max).y) &&
     (fVar30 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar26 = -(uint)(fVar27 <= fVar30),
     fVar30 = (float)(~uVar26 & (uint)fVar27 | uVar26 & (uint)fVar30),
     uVar26 = -(uint)(fVar34 <= fVar30),
     fVar30 = (float)(~uVar26 & (uint)fVar34 | uVar26 & (uint)fVar30), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar30 && fVar30 != *pfVar1)) {
    fVar30 = fVar2;
    if (fVar4 <= fVar2) {
      fVar30 = fVar4;
    }
    if (fVar28 <= fVar30) {
      fVar30 = fVar28;
    }
    if (fVar32 <= fVar30) {
      fVar30 = fVar32;
    }
    bVar23 = false;
    if (fVar30 < (cull_rect->Max).x) {
      fVar30 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar26 = -(uint)(fVar28 <= fVar30);
      fVar30 = (float)(~uVar26 & (uint)fVar28 | uVar26 & (uint)fVar30);
      uVar26 = -(uint)(fVar32 <= fVar30);
      fVar30 = (float)(~uVar26 & (uint)fVar32 | uVar26 & (uint)fVar30);
      bVar23 = (cull_rect->Min).x <= fVar30 && fVar30 != (cull_rect->Min).x;
    }
  }
  IVar29.y = fVar27;
  IVar29.x = fVar28;
  IVar31.y = fVar34;
  IVar31.x = fVar32;
  if (bVar23 != false) {
    fVar30 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar36 = fVar2 * fVar27 - fVar28 * fVar3;
    fVar35 = fVar4 * fVar34 - fVar32 * fVar5;
    fVar33 = (fVar2 - fVar28) * (fVar5 - fVar34) - (fVar4 - fVar32) * (fVar3 - fVar27);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = this->Col;
    pIVar15[1].pos = IVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = this->Col;
    IVar19.y = ((fVar5 - fVar34) * fVar36 - (fVar3 - fVar27) * fVar35) / fVar33;
    IVar19.x = (fVar36 * (fVar4 - fVar32) - (fVar2 - fVar28) * fVar35) / fVar33;
    pIVar15[2].pos = IVar19;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = this->Col;
    pIVar15[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = this->Col;
    pIVar15[4].pos = IVar31;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar15 + 5;
    uVar26 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar25 = (ImDrawIdx)uVar26;
    *pIVar16 = IVar25;
    uVar20 = -(ushort)(fVar6 < fVar30 && fVar27 < fVar34 || fVar30 < fVar6 && fVar34 < fVar27) & 1;
    pIVar16[1] = IVar25 + uVar20 + 1;
    pIVar16[2] = IVar25 + 3;
    pIVar16[3] = IVar25 + 1;
    pIVar16[4] = (uVar20 ^ 3) + IVar25;
    pIVar16[5] = IVar25 + 4;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar26 + 5;
  }
  this->P11 = IVar29;
  this->P12 = IVar31;
  return bVar23;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }